

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O1

location_type_t parse_location_type(char *value)

{
  int iVar1;
  location_type_t lVar2;
  
  iVar1 = strcmp(value,"0");
  lVar2 = LT_STOP;
  if ((iVar1 != 0) && (*value != '\0')) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      lVar2 = LT_STATION;
    }
    else {
      iVar1 = strcmp(value,"2");
      lVar2 = LT_NOT_SET - (iVar1 == 0);
    }
  }
  return lVar2;
}

Assistant:

location_type_t parse_location_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return LT_STOP;
    else if (strcmp(value, "1") == 0)
        return LT_STATION;
    else if (strcmp(value, "2") == 0)
        return LT_STATION_ENTRANCE_EXIT;
    else
        return LT_NOT_SET;
}